

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

bool iutest::internal::
     iuOperatorEQ<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
               (iu_basic_string_view<char,_std::char_traits<char>_> *v1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2)

{
  size_t __n;
  int iVar1;
  
  __n = v1->m_size;
  if (v2->_M_string_length != __n) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp(v1->m_data,(v2->_M_dataplus)._M_p,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

bool iuOperatorEQ(const T1& v1, const T2& v2)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()
IUTEST_PRAGMA_WARN_DISABLE_IMPLICIT_INT_FLOAT_CONVERSION()
    return v1 == v2;
IUTEST_PRAGMA_WARN_POP()
}